

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

ostream * __thiscall Table::print_table(Table *this,ostream *outs)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer __nbytes;
  long lVar3;
  char *pcVar4;
  Table *pTVar5;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *other;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pPVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pbVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  row;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  sorted;
  Record r;
  fstream file_stream;
  char local_449;
  Table *local_448;
  Iterator local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_418;
  Record local_3d8;
  fstream local_240 [528];
  
  std::fstream::fstream(local_240);
  get_filename_abi_cxx11_((string *)&local_3d8,this);
  bin_io::open_fileRW(local_240,(char *)local_3d8._0_8_);
  pcVar4 = (char *)((long)&local_3d8 + 0x10);
  if ((char *)local_3d8._0_8_ != pcVar4) {
    operator_delete((void *)local_3d8._0_8_);
  }
  lVar12 = *(long *)outs;
  *(undefined8 *)(outs + *(long *)(lVar12 + -0x18) + 0x10) = 8;
  lVar12 = *(long *)(lVar12 + -0x18);
  *(uint *)(outs + lVar12 + 0x18) = *(uint *)(outs + lVar12 + 0x18) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(outs,"Num",3);
  pbVar11 = (this->columns).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->columns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_448 = this;
  if (pbVar11 != pbVar1) {
    do {
      pcVar2 = (pbVar11->_M_dataplus)._M_p;
      local_3d8._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,pcVar2,pcVar2 + pbVar11->_M_string_length);
      lVar12 = *(long *)outs;
      *(undefined8 *)(outs + *(long *)(lVar12 + -0x18) + 0x10) = 0x14;
      lVar12 = *(long *)(lVar12 + -0x18);
      *(uint *)(outs + lVar12 + 0x18) = *(uint *)(outs + lVar12 + 0x18) & 0xffffff4f | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                (outs,(char *)local_3d8._0_8_,local_3d8.buffer[0]._4_8_);
      if ((char *)local_3d8._0_8_ != pcVar4) {
        operator_delete((void *)local_3d8._0_8_);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar1);
  }
  local_3d8.record_number._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(outs,(char *)&local_3d8,1);
  pTVar5 = local_448;
  local_3d8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct
            ((ulong)&local_3d8,
             (char)((long)(local_448->columns).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_448->columns).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * '\x05');
  std::__ostream_insert<char,std::char_traits<char>>
            (outs,(char *)local_3d8._0_8_,local_3d8.buffer[0]._4_8_);
  if ((char *)local_3d8._0_8_ != pcVar4) {
    operator_delete((void *)local_3d8._0_8_);
  }
  local_3d8.record_number._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(outs,(char *)&local_3d8,1);
  Record::Record(&local_3d8);
  other = &Index::operator[](&pTVar5->index,
                             (pTVar5->columns).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->tree;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::BPlusTree(&local_418,other);
  local_440 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
              ::begin(&local_418);
  if (local_440.node_ptr ==
      (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
       *)0x0) {
LAB_00115962:
    std::fstream::close();
    BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::~BPlusTree(&local_418);
    std::fstream::~fstream(local_240);
    return outs;
  }
  iVar8 = 1;
  uVar10 = 0;
  do {
    while( true ) {
      pPVar6 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               ::Iterator::operator->(&local_440);
      if (uVar10 < (ulong)((long)(pPVar6->values).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar6->values).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3)) break;
      if (local_440.offset < (local_440.node_ptr)->data_size - 1) {
        local_440.offset = local_440.offset + 1;
      }
      else {
        local_440.node_ptr = (local_440.node_ptr)->next;
        local_440.offset = 0;
      }
      uVar10 = 0;
      if (local_440.node_ptr ==
          (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
           *)0x0) goto LAB_00115962;
    }
    lVar12 = *(long *)outs;
    *(undefined8 *)(outs + *(long *)(lVar12 + -0x18) + 0x10) = 8;
    lVar12 = *(long *)(lVar12 + -0x18);
    *(uint *)(outs + lVar12 + 0x18) = *(uint *)(outs + lVar12 + 0x18) & 0xffffff4f | 0x20;
    std::ostream::operator<<((ostream *)outs,iVar8);
    pPVar6 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             ::Iterator::operator->(&local_440);
    __nbytes = (pPVar6->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((ulong)((long)(pPVar6->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__nbytes >> 3) <= uVar10) {
      uVar7 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_430);
      BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::~BPlusTree(&local_418);
      std::fstream::~fstream(local_240);
      _Unwind_Resume(uVar7);
    }
    Record::read(&local_3d8,(int)local_240,(void *)__nbytes[uVar10],(size_t)__nbytes);
    local_448 = (Table *)CONCAT44(local_448._4_4_,iVar8);
    Record::to_vector_abi_cxx11_(&local_430,&local_3d8);
    if (local_430.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_430.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = 8;
      uVar9 = 0;
      do {
        lVar3 = *(long *)outs;
        *(undefined8 *)(outs + *(long *)(lVar3 + -0x18) + 0x10) = 0x14;
        lVar3 = *(long *)(lVar3 + -0x18);
        *(uint *)(outs + lVar3 + 0x18) = *(uint *)(outs + lVar3 + 0x18) & 0xffffff4f | 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  (outs,*(char **)((long)local_430.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8),
                   *(long *)((long)&((local_430.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar12));
        uVar9 = uVar9 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar9 < (ulong)((long)local_430.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_430.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_449 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(outs,&local_449,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_430);
    uVar10 = uVar10 + 1;
    iVar8 = (int)local_448 + 1;
  } while( true );
}

Assistant:

std::ostream& Table::print_table(std::ostream& outs) {
    const int NUM_WIDTH = 8;
    std::fstream file_stream;
    bin_io::open_fileRW(file_stream, get_filename().c_str());
    outs << std::setw(NUM_WIDTH) << std::left << "Num";
    for (auto e : columns) {
        outs << std::setw(constants::MAX_BLOCK_COLS) << std::left;
        outs << e;
    }
    outs << '\n';
    outs << std::string(columns.size() * constants::MAX_BLOCK_COLS, '-');
    outs << '\n';

    Record r;
    // sort by first column
    MultiMap::MultiMap<std::string, long> sorted = index[columns[0]];
    int num = 1;
    for (auto it = sorted.begin(); it != nullptr; ++it) {
        for (size_t i = 0; i < it->size(); ++i, ++num) {
            outs << std::setw(NUM_WIDTH) << std::left << num;
            r.read(file_stream, it->at(i));
            auto row = r.to_vector();
            for (size_t j = 0; j < row.size(); ++j) {
                outs << std::setw(constants::MAX_BLOCK_COLS) << std::left;
                outs << row[j];
            }
            outs << '\n';
        }
    }
    file_stream.close();
    return outs;
}